

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O1

adjusted_mantissa __thiscall
fast_float::negative_digit_comp<double>
          (fast_float *this,bigint *bigmant,adjusted_mantissa am,int32_t exponent)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  fast_float *this_00;
  int iVar9;
  uint uVar10;
  adjusted_mantissa aVar11;
  bigint theor_digits;
  bigint local_228;
  
  iVar8 = am.power2;
  iVar3 = (int)am.mantissa;
  if (iVar3 < -10) {
    iVar7 = 1 - iVar3;
    iVar9 = 0;
    if (iVar7 < 0x40) {
      iVar9 = iVar7;
    }
    uVar4 = 0;
    if (iVar7 < 0x40) {
      uVar4 = (ulong)bigmant >> ((byte)iVar9 & 0x3f);
    }
    uVar6 = (ulong)(0xfffffffffffff < uVar4);
  }
  else {
    uVar6 = 0x7ff;
    uVar4 = 0;
    if (iVar3 < 0x7f4) {
      uVar6 = (ulong)(iVar3 + 0xb);
      uVar4 = (ulong)bigmant >> 0xb & 0xfffffffffffff;
    }
  }
  uVar6 = (uVar6 << 0x34 | uVar4) & 0x7ff0000000000000;
  if (uVar6 == 0) {
    uVar4 = uVar4 & 0xfffffffffffff;
    iVar9 = -0x433;
  }
  else {
    uVar4 = (uVar4 & 0xfffffffffffff) + 0x10000000000000;
    iVar9 = (uint)(uVar6 >> 0x34) - 0x434;
  }
  memset((fast_float *)&local_228,0,0x1f8);
  local_228.vec.data[0] = uVar4 * 2 + 1;
  local_228.vec.length = 1;
  uVar10 = iVar9 - iVar8;
  if (iVar8 != 0) {
    bigint::pow5(&local_228,-iVar8);
  }
  this_00 = (fast_float *)&local_228;
  if ((int)uVar10 < 1) {
    if (-1 < (int)uVar10) goto LAB_0012d81e;
    uVar10 = -uVar10;
    this_00 = this;
  }
  bigint::shl((bigint *)this_00,(ulong)uVar10);
LAB_0012d81e:
  uVar1 = *(ushort *)(this + 0x1f0);
  uVar4 = (ulong)uVar1;
  iVar8 = 1;
  if ((uVar1 <= local_228.vec.length) && (iVar8 = -1, local_228.vec.length <= uVar1)) {
    do {
      if (uVar4 == 0) {
        iVar8 = 0;
        break;
      }
      uVar6 = *(ulong *)(this + (uVar4 - 1) * 8);
      uVar5 = local_228.vec.data[uVar4 - 1];
      if (uVar6 < uVar5) {
        iVar8 = -1;
      }
      if (uVar5 < uVar6) {
        iVar8 = 1;
      }
      uVar4 = uVar4 - 1;
    } while (uVar6 == uVar5);
  }
  if (iVar3 < -10) {
    iVar3 = 1 - iVar3;
    iVar9 = 0;
    if (iVar3 < 0x40) {
      iVar9 = iVar3;
    }
    uVar4 = 0;
    if (iVar3 < 0x40) {
      uVar4 = (ulong)bigmant >> ((byte)iVar9 & 0x3f);
    }
    uVar6 = 1;
    if (iVar8 < 1) {
      uVar6 = (ulong)(iVar8 == 0 & (byte)uVar4);
    }
    uVar5 = uVar6 + uVar4;
    uVar10 = (uint)(0xfffffffffffff < uVar6 + uVar4);
  }
  else {
    uVar4 = 1;
    if (iVar8 < 1) {
      uVar4 = (ulong)(iVar8 == 0 & (byte)((ulong)bigmant >> 0xb));
    }
    uVar4 = uVar4 + ((ulong)bigmant >> 0xb);
    bVar2 = uVar4 >> 0x35 == 0;
    uVar10 = (iVar3 - (uint)bVar2) + 0xc;
    uVar5 = uVar4 & 0x2fffffffffffff;
    if (!bVar2) {
      uVar5 = 0;
    }
    if (0x7fe < (int)uVar10) {
      uVar5 = 0;
      uVar10 = 0x7ff;
    }
  }
  aVar11.power2 = uVar10;
  aVar11.mantissa = uVar5;
  aVar11._12_4_ = 0;
  return aVar11;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa negative_digit_comp(bigint& bigmant, adjusted_mantissa am, int32_t exponent) noexcept {
  bigint& real_digits = bigmant;
  int32_t real_exp = exponent;

  // get the value of `b`, rounded down, and get a bigint representation of b+h
  adjusted_mantissa am_b = am;
  // gcc7 buf: use a lambda to remove the noexcept qualifier bug with -Wnoexcept-type.
  round<T>(am_b, [](adjusted_mantissa&a, int32_t shift) { round_down(a, shift); });
  T b;
  to_float(false, am_b, b);
  adjusted_mantissa theor = to_extended_halfway(b);
  bigint theor_digits(theor.mantissa);
  int32_t theor_exp = theor.power2;

  // scale real digits and theor digits to be same power.
  int32_t pow2_exp = theor_exp - real_exp;
  uint32_t pow5_exp = uint32_t(-real_exp);
  if (pow5_exp != 0) {
    FASTFLOAT_ASSERT(theor_digits.pow5(pow5_exp));
  }
  if (pow2_exp > 0) {
    FASTFLOAT_ASSERT(theor_digits.pow2(uint32_t(pow2_exp)));
  } else if (pow2_exp < 0) {
    FASTFLOAT_ASSERT(real_digits.pow2(uint32_t(-pow2_exp)));
  }

  // compare digits, and use it to director rounding
  int ord = real_digits.compare(theor_digits);
  adjusted_mantissa answer = am;
  round<T>(answer, [ord](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [ord](bool is_odd, bool _, bool __) -> bool {
      (void)_;  // not needed, since we've done our comparison
      (void)__; // not needed, since we've done our comparison
      if (ord > 0) {
        return true;
      } else if (ord < 0) {
        return false;
      } else {
        return is_odd;
      }
    });
  });

  return answer;
}